

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::copy_file(Twine *From,Twine *To)

{
  bool bVar1;
  error_code eVar2;
  int local_30;
  int local_2c;
  int WriteFD;
  int ReadFD;
  Twine *To_local;
  Twine *From_local;
  error_code EC;
  
  _WriteFD = To;
  To_local = From;
  eVar2 = openFileForRead(From,&local_2c,F_None,(SmallVectorImpl<char> *)0x0);
  EC._0_8_ = eVar2._M_cat;
  From_local._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&From_local);
  if (!bVar1) {
    eVar2 = openFileForWrite(_WriteFD,&local_30,CD_CreateAlways,F_None,0x1b6);
    EC._0_8_ = eVar2._M_cat;
    From_local._0_4_ = eVar2._M_value;
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&From_local);
    if (bVar1) {
      close(local_2c);
    }
    else {
      eVar2 = copy_file_internal(local_2c,local_30);
      EC._0_8_ = eVar2._M_cat;
      From_local._0_4_ = eVar2._M_value;
      close(local_2c);
      close(local_30);
    }
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)From_local;
  eVar2._M_cat = (error_category *)EC._0_8_;
  return eVar2;
}

Assistant:

std::error_code copy_file(const Twine &From, const Twine &To) {
  int ReadFD, WriteFD;
  if (std::error_code EC = openFileForRead(From, ReadFD, OF_None))
    return EC;
  if (std::error_code EC =
          openFileForWrite(To, WriteFD, CD_CreateAlways, OF_None)) {
    close(ReadFD);
    return EC;
  }

  std::error_code EC = copy_file_internal(ReadFD, WriteFD);

  close(ReadFD);
  close(WriteFD);

  return EC;
}